

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *
__thiscall
libtorrent::aux::piece_picker::get_downloaders
          (vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
           *__return_storage_ptr__,piece_picker *this,piece_index_t index)

{
  bool bVar1;
  value_type *this_00;
  unsigned_long __n;
  reference dp;
  block_info *__x;
  span<const_libtorrent::aux::piece_picker::block_info> sVar2;
  int local_74;
  undefined1 auStack_70 [4];
  int j;
  span<const_libtorrent::aux::piece_picker::block_info> binfo;
  __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_58;
  const_iterator i;
  value_type local_48;
  int local_3c;
  int local_38;
  int num_blocks;
  int local_28;
  strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> local_22;
  undefined1 local_21;
  download_queue_t state;
  piece_picker *ppStack_20;
  piece_picker *this_local;
  piece_index_t index_local;
  vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_> *d;
  
  local_21 = 0;
  ppStack_20 = this;
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  vector(__return_storage_ptr__);
  local_28 = index.m_val;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)index.m_val);
  local_22.m_val = (uchar)piece_pos::download_queue(this_00);
  local_3c = index.m_val;
  local_38 = blocks_in_piece(this,index);
  __n = numeric_cast<unsigned_long,int,void>(local_38);
  ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
  reserve(__return_storage_ptr__,__n);
  bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                    (&local_22,&piece_pos::piece_open);
  if (bVar1) {
    local_48 = (value_type)0x0;
    ::std::vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
    ::resize(__return_storage_ptr__,(long)local_38,&local_48);
  }
  else {
    binfo.m_len._7_1_ = local_22.m_val;
    binfo.m_len._0_4_ = index.m_val;
    local_58._M_current =
         (downloading_piece *)find_dl_piece(this,(download_queue_t)local_22.m_val,index);
    dp = __gnu_cxx::
         __normal_iterator<const_libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
         ::operator*(&local_58);
    sVar2 = blocks_for_piece(this,dp);
    local_74 = 0;
    while( true ) {
      binfo.m_ptr = (block_info *)sVar2.m_len;
      _auStack_70 = sVar2.m_ptr;
      if (local_74 == local_38) break;
      __x = span<const_libtorrent::aux::piece_picker::block_info>::operator[]
                      ((span<const_libtorrent::aux::piece_picker::block_info> *)auStack_70,
                       (long)local_74);
      ::std::
      vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>::
      push_back(__return_storage_ptr__,&__x->peer);
      sVar2.m_len = (difference_type)binfo.m_ptr;
      sVar2.m_ptr = _auStack_70;
      local_74 = local_74 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<aux::torrent_peer*> piece_picker::get_downloaders(piece_index_t const index) const
	{
		std::vector<aux::torrent_peer*> d;
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			d.resize(std::size_t(num_blocks), nullptr);
			return d;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
		return d;
	}